

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O3

void duckdb::Bit::BitwiseOr(bitstring_t *rhs,bitstring_t *lhs,bitstring_t *result)

{
  ulong uVar1;
  char *pcVar2;
  InvalidInputException *this;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  char *pcVar6;
  char *pcVar7;
  string local_40;
  
  uVar3 = *(ulong *)&lhs->value;
  pcVar2 = (lhs->value).pointer.ptr;
  if ((uint)uVar3 < 0xd) {
    bVar5 = (byte)(uVar3 >> 0x20);
  }
  else {
    bVar5 = *pcVar2;
  }
  uVar1 = *(ulong *)&rhs->value;
  pcVar6 = (rhs->value).pointer.ptr;
  if ((uint)uVar1 < 0xd) {
    bVar4 = (byte)(uVar1 >> 0x20);
  }
  else {
    bVar4 = *pcVar6;
  }
  if (((uVar3 & 0xffffffff) * 8 - (ulong)bVar5) + -8 ==
      ((uVar1 & 0xffffffff) * 8 - (ulong)bVar4) + -8) {
    if ((result->value).pointer.length < 0xd) {
      pcVar7 = (result->value).pointer.prefix;
    }
    else {
      pcVar7 = (result->value).pointer.ptr;
    }
    if ((uint)uVar1 < 0xd) {
      pcVar6 = (rhs->value).pointer.prefix;
    }
    if ((uint)uVar3 < 0xd) {
      pcVar2 = (lhs->value).pointer.prefix;
    }
    *pcVar7 = *pcVar2;
    if (1 < (lhs->value).pointer.length) {
      uVar3 = 1;
      do {
        pcVar7[uVar3] = pcVar6[uVar3] | pcVar2[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < (lhs->value).pointer.length);
    }
    Finalize(result);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot OR bit strings of different sizes","");
  InvalidInputException::InvalidInputException(this,&local_40);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Bit::BitwiseOr(const bitstring_t &rhs, const bitstring_t &lhs, bitstring_t &result) {
	if (Bit::BitLength(lhs) != Bit::BitLength(rhs)) {
		throw InvalidInputException("Cannot OR bit strings of different sizes");
	}

	uint8_t *buf = reinterpret_cast<uint8_t *>(result.GetDataWriteable());
	const uint8_t *r_buf = reinterpret_cast<const uint8_t *>(rhs.GetData());
	const uint8_t *l_buf = reinterpret_cast<const uint8_t *>(lhs.GetData());

	buf[0] = l_buf[0];
	for (idx_t i = 1; i < lhs.GetSize(); i++) {
		buf[i] = l_buf[i] | r_buf[i];
	}
	Bit::Finalize(result);
}